

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O0

void av1_copy_tree_context(PICK_MODE_CONTEXT *dst_ctx,PICK_MODE_CONTEXT *src_ctx)

{
  void *in_RSI;
  void *in_RDI;
  
  memcpy(in_RDI,in_RSI,0xb0);
  memcpy((void *)((long)in_RDI + 0xb0),(void *)((long)in_RSI + 0xb0),0x54);
  *(undefined4 *)((long)in_RDI + 0x1a0) = *(undefined4 *)((long)in_RSI + 0x1a0);
  *(undefined4 *)((long)in_RDI + 0x1a4) = *(undefined4 *)((long)in_RSI + 0x1a4);
  memcpy(*(void **)((long)in_RDI + 0x118),*(void **)((long)in_RSI + 0x118),
         (long)*(int *)((long)in_RSI + 0x1a0));
  memcpy(*(void **)((long)in_RDI + 0x198),*(void **)((long)in_RSI + 0x198),
         (long)*(int *)((long)in_RSI + 0x1a0));
  memcpy((void *)((long)in_RDI + 0x1a8),(void *)((long)in_RSI + 0x1a8),0x28);
  *(undefined4 *)((long)in_RDI + 0x1d0) = *(undefined4 *)((long)in_RSI + 0x1d0);
  return;
}

Assistant:

void av1_copy_tree_context(PICK_MODE_CONTEXT *dst_ctx,
                           PICK_MODE_CONTEXT *src_ctx) {
  dst_ctx->mic = src_ctx->mic;
  dst_ctx->mbmi_ext_best = src_ctx->mbmi_ext_best;

  dst_ctx->num_4x4_blk = src_ctx->num_4x4_blk;
  dst_ctx->skippable = src_ctx->skippable;
#if CONFIG_INTERNAL_STATS
  dst_ctx->best_mode_index = src_ctx->best_mode_index;
#endif  // CONFIG_INTERNAL_STATS

  memcpy(dst_ctx->blk_skip, src_ctx->blk_skip,
         sizeof(uint8_t) * src_ctx->num_4x4_blk);
  av1_copy_array(dst_ctx->tx_type_map, src_ctx->tx_type_map,
                 src_ctx->num_4x4_blk);

  dst_ctx->rd_stats = src_ctx->rd_stats;
  dst_ctx->rd_mode_is_ready = src_ctx->rd_mode_is_ready;
}